

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall
Generators_Hammersley2D_Test::~Generators_Hammersley2D_Test(Generators_Hammersley2D_Test *this)

{
  void *in_RDI;
  
  ~Generators_Hammersley2D_Test((Generators_Hammersley2D_Test *)0x655218);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Generators, Hammersley2D) {
    int count = 0;
    for (Point2f u : Hammersley2D(32)) {
        EXPECT_EQ((Float)count / 32.f, u[0]);
        EXPECT_EQ(RadicalInverse(0, count), u[1]);
        ++count;
    }
    EXPECT_EQ(32, count);
}